

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_expression.cpp
# Opt level: O1

vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> * __thiscall
duckdb::LambdaExpression::ExtractColumnRefExpressions
          (vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> *__return_storage_ptr__,
          LambdaExpression *this,string *error_message)

{
  ExpressionClass EVar1;
  iterator iVar2;
  pointer puVar3;
  ParsedExpression *pPVar4;
  int iVar5;
  pointer pPVar6;
  type pPVar7;
  BaseExpression *this_00;
  FunctionExpression *pFVar8;
  reference_wrapper<duckdb::ParsedExpression> *prVar9;
  undefined8 uVar10;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar11;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_01
  ;
  pointer this_02;
  size_type __dnew;
  ParsedExpression *local_70;
  ulong local_68;
  uint local_5c;
  reference_wrapper<duckdb::ParsedExpression> *local_58;
  ParsedExpression *local_50;
  reference_wrapper<duckdb::ParsedExpression> local_48 [2];
  string *local_38;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->lhs;
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(this_01);
  if ((pPVar6->super_BaseExpression).expression_class == COLUMN_REF) {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(this_01);
    iVar2._M_current =
         (__return_storage_ptr__->
         super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         ).
         super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current !=
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar2._M_current)->_M_data = pPVar7;
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      return __return_storage_ptr__;
    }
    ::std::
    vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
    ::_M_realloc_insert<duckdb::ParsedExpression&>
              ((vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
                *)__return_storage_ptr__,iVar2,pPVar7);
    return __return_storage_ptr__;
  }
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(this_01);
  if ((pPVar6->super_BaseExpression).expression_class == FUNCTION) {
    this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01)->super_BaseExpression;
    pFVar8 = BaseExpression::Cast<duckdb::FunctionExpression>(this_00);
    iVar5 = ::std::__cxx11::string::compare((char *)&pFVar8->function_name);
    local_38 = error_message;
    if (iVar5 == 0) {
      this_02 = (pFVar8->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pFVar8->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar11 = CONCAT71((int7)((ulong)error_message >> 8),this_02 == puVar3);
      if (this_02 == puVar3) {
        local_68 = 0;
      }
      else {
        local_68 = 0;
        do {
          pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(this_02);
          EVar1 = (pPVar6->super_BaseExpression).expression_class;
          if (EVar1 == COLUMN_REF) {
            pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator*(this_02);
            iVar2._M_current =
                 (__return_storage_ptr__->
                 super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->
                super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                ).
                super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
              ::_M_realloc_insert<duckdb::ParsedExpression&>
                        ((vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
                          *)__return_storage_ptr__,iVar2,pPVar7);
            }
            else {
              (iVar2._M_current)->_M_data = pPVar7;
              (__return_storage_ptr__->
              super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
              ).
              super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          else {
            local_5c = (uint)uVar11;
            local_70 = (ParsedExpression *)0x61;
            local_58 = local_48;
            prVar9 = (reference_wrapper<duckdb::ParsedExpression> *)
                     ::std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_70);
            pPVar4 = local_70;
            local_48[0]._M_data = local_70;
            local_58 = prVar9;
            switchD_00b1422a::default
                      (prVar9,
                       "Invalid lambda parameters! Parameters must be unqualified comma-separated names like x or (x, y)."
                       ,0x61);
            local_50 = pPVar4;
            *(undefined1 *)
             ((long)&(pPVar4->super_BaseExpression)._vptr_BaseExpression + (long)&prVar9->_M_data) =
                 0;
            uVar10 = ::std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
            if (local_58 != local_48) {
              operator_delete(local_58);
              uVar10 = extraout_RAX_00;
            }
            local_68 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            uVar11 = (ulong)local_5c;
          }
          if (EVar1 != COLUMN_REF) break;
          this_02 = this_02 + 1;
          uVar11 = CONCAT71((int7)(uVar11 >> 8),this_02 == puVar3);
        } while (this_02 != puVar3);
      }
    }
    else {
      local_70 = (ParsedExpression *)0x61;
      local_58 = local_48;
      prVar9 = (reference_wrapper<duckdb::ParsedExpression> *)
               ::std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_70);
      pPVar4 = local_70;
      local_48[0]._M_data = local_70;
      local_58 = prVar9;
      switchD_00b1422a::default
                (prVar9,
                 "Invalid lambda parameters! Parameters must be unqualified comma-separated names like x or (x, y)."
                 ,0x61);
      local_50 = pPVar4;
      *(undefined1 *)
       ((long)&(pPVar4->super_BaseExpression)._vptr_BaseExpression + (long)&prVar9->_M_data) = 0;
      uVar10 = ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_58);
      if (local_58 != local_48) {
        operator_delete(local_58);
        uVar10 = extraout_RAX;
      }
      local_68 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
      uVar11 = 0;
    }
    error_message = local_38;
    if ((uVar11 & 1) == 0) {
      if ((local_68 & 1) != 0) {
        return __return_storage_ptr__;
      }
      prVar9 = (__return_storage_ptr__->
               super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (prVar9 == (reference_wrapper<duckdb::ParsedExpression> *)0x0) {
        return __return_storage_ptr__;
      }
      goto LAB_00762749;
    }
  }
  if ((__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  local_70 = (ParsedExpression *)0x61;
  local_58 = local_48;
  prVar9 = (reference_wrapper<duckdb::ParsedExpression> *)
           ::std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_70);
  pPVar4 = local_70;
  local_48[0]._M_data = local_70;
  local_58 = prVar9;
  switchD_00b1422a::default
            (prVar9,
             "Invalid lambda parameters! Parameters must be unqualified comma-separated names like x or (x, y)."
             ,0x61);
  local_50 = pPVar4;
  *(undefined1 *)
   ((long)&(pPVar4->super_BaseExpression)._vptr_BaseExpression + (long)&prVar9->_M_data) = 0;
  ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_58);
  prVar9 = local_58;
  if (local_58 == local_48) {
    return __return_storage_ptr__;
  }
LAB_00762749:
  operator_delete(prVar9);
  return __return_storage_ptr__;
}

Assistant:

vector<reference<ParsedExpression>> LambdaExpression::ExtractColumnRefExpressions(string &error_message) {

	// we return an error message because we can't throw a binder exception here,
	// since we can't distinguish between a lambda function and the JSON operator yet
	vector<reference<ParsedExpression>> column_refs;

	if (lhs->GetExpressionClass() == ExpressionClass::COLUMN_REF) {
		// single column reference
		column_refs.emplace_back(*lhs);
		return column_refs;
	}

	if (lhs->GetExpressionClass() == ExpressionClass::FUNCTION) {
		// list of column references
		auto &func_expr = lhs->Cast<FunctionExpression>();
		if (func_expr.function_name != "row") {
			error_message = InvalidParametersErrorMessage();
			return column_refs;
		}

		for (auto &child : func_expr.children) {
			if (child->GetExpressionClass() != ExpressionClass::COLUMN_REF) {
				error_message = InvalidParametersErrorMessage();
				return column_refs;
			}
			column_refs.emplace_back(*child);
		}
	}

	if (column_refs.empty()) {
		error_message = InvalidParametersErrorMessage();
	}
	return column_refs;
}